

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::setupTables(TranslateToFuzzReader *this)

{
  Random *pRVar1;
  long *plVar2;
  Module *pMVar3;
  size_t sVar4;
  ElementSegment *pEVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Const *pCVar8;
  size_t *psVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  pointer ppEVar13;
  pointer ppEVar14;
  char *pcVar15;
  pointer ppEVar16;
  Name NVar17;
  string_view sVar18;
  IString IVar19;
  Literal local_58;
  pointer local_40;
  ElementSegment *local_38;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> tablePtr;
  
  plVar10 = *(long **)(this->wasm + 0xa8);
  plVar2 = *(long **)(this->wasm + 0xb0);
  lVar12 = (long)plVar2 - (long)plVar10 >> 5;
  plVar11 = plVar10;
  if (0 < lVar12) {
    plVar11 = (long *)(((long)plVar2 - (long)plVar10 & 0xffffffffffffffe0U) + (long)plVar10);
    lVar12 = lVar12 + 1;
    plVar10 = plVar10 + 2;
    do {
      if (*(long *)(plVar10[-2] + 0x50) == 0x12) {
        plVar10 = plVar10 + -2;
        goto LAB_00125541;
      }
      if (*(long *)(plVar10[-1] + 0x50) == 0x12) {
        plVar10 = plVar10 + -1;
        goto LAB_00125541;
      }
      if (*(long *)(*plVar10 + 0x50) == 0x12) goto LAB_00125541;
      if (*(long *)(plVar10[1] + 0x50) == 0x12) {
        plVar10 = plVar10 + 1;
        goto LAB_00125541;
      }
      lVar12 = lVar12 + -1;
      plVar10 = plVar10 + 4;
    } while (1 < lVar12);
  }
  lVar12 = (long)plVar2 - (long)plVar11 >> 3;
  if (lVar12 == 1) {
LAB_00125520:
    plVar10 = plVar11;
    if (*(long *)(*plVar11 + 0x50) != 0x12) {
      plVar10 = plVar2;
    }
  }
  else if (lVar12 == 2) {
LAB_00125512:
    plVar10 = plVar11;
    if (*(long *)(*plVar11 + 0x50) != 0x12) {
      plVar11 = plVar11 + 1;
      goto LAB_00125520;
    }
  }
  else {
    plVar10 = plVar2;
    if ((lVar12 == 3) && (plVar10 = plVar11, *(long *)(*plVar11 + 0x50) != 0x12)) {
      plVar11 = plVar11 + 1;
      goto LAB_00125512;
    }
  }
LAB_00125541:
  if (plVar10 == plVar2) {
    pRVar1 = &this->random;
    uVar6 = Random::upTo(pRVar1,10);
    ppEVar16 = (pointer)(ulong)uVar6;
    uVar6 = Random::upTo(pRVar1,2);
    ppEVar14 = (pointer)0xffffffffffffffff;
    if (uVar6 == 0) {
      uVar6 = Random::upTo(pRVar1,4);
      ppEVar14 = (pointer)((long)ppEVar16 + (ulong)uVar6);
    }
    ppEVar13 = (pointer)0x2;
    local_40 = ppEVar16;
    if (((byte)this->wasm[0x179] & 8) != 0) {
      uVar6 = Random::upTo(pRVar1,2);
      ppEVar13 = (pointer)((ulong)(uVar6 == 0) + 2);
    }
    pMVar3 = this->wasm;
    NVar17.super_IString.str = (IString)wasm::IString::interned(0xd,"fuzzing_table",0);
    sVar18 = (string_view)Names::getValidTableName(pMVar3,NVar17);
    local_38 = (ElementSegment *)operator_new(0x58);
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_38->super_Named).name.super_IString.str._M_len = 0;
    (local_38->super_Named).name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(local_38->super_Named).hasExplicitName = 0;
    (local_38->table).super_IString.str._M_len = 0;
    (local_38->table).super_IString.str._M_str = (char *)0x0;
    local_38->offset = (Expression *)0x0;
    (local_38->type).id = 0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0xffffffff;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
    local_38[1].super_Named.name.super_IString.str._M_len = 0x12;
    (local_38->super_Named).name.super_IString.str = sVar18;
    local_38[1].super_Named.name.super_IString.str._M_len = 0x12;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = ppEVar13;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = local_40;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppEVar14;
    (local_38->super_Named).hasExplicitName = true;
    psVar9 = (size_t *)wasm::Module::addTable((unique_ptr *)this->wasm);
    if (local_38 != (ElementSegment *)0x0) {
      operator_delete(local_38,0x58);
    }
  }
  else {
    psVar9 = (size_t *)*plVar10;
  }
  pcVar15 = (char *)psVar9[1];
  (this->funcrefTableName).super_IString.str._M_len = *psVar9;
  (this->funcrefTableName).super_IString.str._M_str = pcVar15;
  pMVar3 = this->wasm;
  plVar10 = *(long **)(pMVar3 + 0x60);
  plVar2 = *(long **)(pMVar3 + 0x68);
  lVar12 = (long)plVar2 - (long)plVar10 >> 5;
  plVar11 = plVar10;
  if (0 < lVar12) {
    plVar11 = (long *)(((long)plVar2 - (long)plVar10 & 0xffffffffffffffe0U) + (long)plVar10);
    lVar12 = lVar12 + 1;
    plVar10 = plVar10 + 2;
    do {
      if ((*(long *)(plVar10[-2] + 0x20) != 0) && (*(long *)(plVar10[-2] + 0x30) == 0x12)) {
        plVar10 = plVar10 + -2;
        goto LAB_00125774;
      }
      if ((*(long *)(plVar10[-1] + 0x20) != 0) && (*(long *)(plVar10[-1] + 0x30) == 0x12)) {
        plVar10 = plVar10 + -1;
        goto LAB_00125774;
      }
      if ((*(long *)(*plVar10 + 0x20) != 0) && (*(long *)(*plVar10 + 0x30) == 0x12))
      goto LAB_00125774;
      if ((*(long *)(plVar10[1] + 0x20) != 0) && (*(long *)(plVar10[1] + 0x30) == 0x12)) {
        plVar10 = plVar10 + 1;
        goto LAB_00125774;
      }
      lVar12 = lVar12 + -1;
      plVar10 = plVar10 + 4;
    } while (1 < lVar12);
  }
  lVar12 = (long)plVar2 - (long)plVar11 >> 3;
  if (lVar12 == 1) {
LAB_00125749:
    plVar10 = plVar2;
    if ((*(long *)(*plVar11 + 0x20) != 0) && (plVar10 = plVar11, *(long *)(*plVar11 + 0x30) != 0x12)
       ) {
      plVar10 = plVar2;
    }
  }
  else if (lVar12 == 2) {
LAB_00125734:
    if ((*(long *)(*plVar11 + 0x20) == 0) || (plVar10 = plVar11, *(long *)(*plVar11 + 0x30) != 0x12)
       ) {
      plVar11 = plVar11 + 1;
      goto LAB_00125749;
    }
  }
  else {
    plVar10 = plVar2;
    if ((lVar12 == 3) &&
       ((*(long *)(*plVar11 + 0x20) == 0 || (plVar10 = plVar11, *(long *)(*plVar11 + 0x30) != 0x12))
       )) {
      plVar11 = plVar11 + 1;
      goto LAB_00125734;
    }
  }
LAB_00125774:
  NVar17.super_IString.str._M_str = (char *)(this->funcrefTableName).super_IString.str._M_len;
  NVar17.super_IString.str._M_len = (size_t)pMVar3;
  lVar12 = wasm::Module::getTable(NVar17);
  if (plVar10 == plVar2) {
    Literal::makeFromInt32(&local_58,0,(Type)*(uintptr_t *)(lVar12 + 0x48));
    pCVar8 = Builder::makeConst(&this->builder,&local_58);
    local_38 = (ElementSegment *)operator_new(0x50);
    sVar4 = *psVar9;
    pcVar15 = (char *)psVar9[1];
    (local_38->super_Named).name.super_IString.str._M_len = 0;
    (local_38->super_Named).name.super_IString.str._M_str = (char *)0x0;
    (local_38->super_Named).hasExplicitName = false;
    (local_38->table).super_IString.str._M_len = sVar4;
    (local_38->table).super_IString.str._M_str = pcVar15;
    local_38->offset = (Expression *)pCVar8;
    (local_38->type).id = 0x12;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_38->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Literal::~Literal(&local_58);
    pEVar5 = local_38;
    pMVar3 = this->wasm;
    NVar17.super_IString.str = (IString)wasm::IString::interned(5,"elem$",0);
    sVar18 = (string_view)Names::getValidElementSegmentName(pMVar3,NVar17);
    (pEVar5->super_Named).name.super_IString.str = sVar18;
    (pEVar5->super_Named).hasExplicitName = false;
    wasm::Module::addElementSegment((unique_ptr *)this->wasm);
    if (local_38 != (ElementSegment *)0x0) {
      std::default_delete<wasm::ElementSegment>::operator()
                ((default_delete<wasm::ElementSegment> *)&local_38,local_38);
    }
  }
  pMVar3 = this->wasm;
  if (((byte)pMVar3[0x178] & 0x40) == 0) {
    return;
  }
  plVar10 = *(long **)(pMVar3 + 0xa8);
  plVar2 = *(long **)(pMVar3 + 0xb0);
  lVar12 = (long)plVar2 - (long)plVar10 >> 5;
  plVar11 = plVar10;
  if (0 < lVar12) {
    plVar11 = (long *)(((long)plVar2 - (long)plVar10 & 0xffffffffffffffe0U) + (long)plVar10);
    lVar12 = lVar12 + 1;
    plVar10 = plVar10 + 2;
    do {
      if (*(long *)(plVar10[-2] + 0x50) == 0x4a) {
        plVar10 = plVar10 + -2;
        goto LAB_00125916;
      }
      if (*(long *)(plVar10[-1] + 0x50) == 0x4a) {
        plVar10 = plVar10 + -1;
        goto LAB_00125916;
      }
      if (*(long *)(*plVar10 + 0x50) == 0x4a) goto LAB_00125916;
      if (*(long *)(plVar10[1] + 0x50) == 0x4a) {
        plVar10 = plVar10 + 1;
        goto LAB_00125916;
      }
      lVar12 = lVar12 + -1;
      plVar10 = plVar10 + 4;
    } while (1 < lVar12);
  }
  lVar12 = (long)plVar2 - (long)plVar11 >> 3;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      plVar10 = plVar2;
      if ((lVar12 != 3) || (plVar10 = plVar11, *(long *)(*plVar11 + 0x50) == 0x4a))
      goto LAB_00125916;
      plVar11 = plVar11 + 1;
    }
    plVar10 = plVar11;
    if (*(long *)(*plVar11 + 0x50) == 0x4a) goto LAB_00125916;
    plVar11 = plVar11 + 1;
  }
  plVar10 = plVar11;
  if (*(long *)(*plVar11 + 0x50) != 0x4a) {
    plVar10 = plVar2;
  }
LAB_00125916:
  if (plVar10 == plVar2) {
    pRVar1 = &this->random;
    uVar6 = Random::upTo(pRVar1,10);
    uVar7 = Random::upTo(pRVar1,2);
    pcVar15 = (char *)0xffffffffffffffff;
    if (uVar7 == 0) {
      uVar7 = Random::upTo(pRVar1,4);
      pcVar15 = (char *)(ulong)uVar6 + uVar7;
    }
    pMVar3 = this->wasm;
    NVar17.super_IString.str = (IString)wasm::IString::interned(0xc,"exnref_table",0);
    IVar19.str = (string_view)Names::getValidTableName(pMVar3,NVar17);
    local_38 = (ElementSegment *)operator_new(0x58);
    (((IString *)((long)local_38 + 0x40))->str)._M_len = 0;
    *(char **)((long)local_38 + 0x40U + 8) = (char *)0x0;
    (((IString *)local_38)->str)._M_len = 0;
    *(char **)((long)&((IString *)local_38)->str + 8) = (char *)0x0;
    (((IString *)((long)local_38 + 0x10))->str)._M_len = 0;
    *(char **)((long)local_38 + 0x10U + 8) = (char *)0x0;
    (((IString *)((long)local_38 + 0x20))->str)._M_len = 0;
    *(char **)((long)local_38 + 0x20U + 8) = (char *)0x0;
    (((IString *)((long)local_38 + 0x30))->str)._M_len = 0;
    *(char **)((long)local_38 + 0x30U + 8) = (char *)0x0;
    (((IString *)((long)local_38 + 0x40))->str)._M_len = 0xffffffff;
    *(char **)((long)local_38 + 0x40U + 8) = (char *)0x2;
    (((IString *)((long)local_38 + 0x50))->str)._M_len = 0x12;
    ((IString *)local_38)->str = IVar19.str;
    (((IString *)((long)local_38 + 0x50))->str)._M_len = 0x4a;
    *(char **)((long)local_38 + 0x40U + 8) = (char *)0x2;
    *(char **)((long)local_38 + 0x30U + 8) = (char *)(ulong)uVar6;
    *(char **)&((IString *)((long)local_38 + 0x40))->str = pcVar15;
    *(undefined1 *)&((IString *)((long)local_38 + 0x10))->str = 1;
    psVar9 = (size_t *)wasm::Module::addTable((unique_ptr *)this->wasm);
    pcVar15 = (char *)psVar9[1];
    (this->exnrefTableName).super_IString.str._M_len = *psVar9;
    (this->exnrefTableName).super_IString.str._M_str = pcVar15;
    if (local_38 != (ElementSegment *)0x0) {
      operator_delete(local_38,0x58);
    }
  }
  else {
    pcVar15 = (char *)((size_t *)*plVar10)[1];
    (this->exnrefTableName).super_IString.str._M_len = *(size_t *)*plVar10;
    (this->exnrefTableName).super_IString.str._M_str = pcVar15;
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTables() {
  // Ensure a funcref element segment and table exist. Segments with more
  // specific function types may have a smaller chance of getting functions.
  Table* table = nullptr;
  Type funcref = Type(HeapType::func, Nullable);
  auto iter = std::find_if(wasm.tables.begin(),
                           wasm.tables.end(),
                           [&](auto& table) { return table->type == funcref; });
  if (iter != wasm.tables.end()) {
    table = iter->get();
  } else {
    // Start from a potentially empty table.
    Address initial = upTo(10);
    // Make the max potentially higher, or unlimited.
    Address max;
    if (oneIn(2)) {
      max = initial + upTo(4);
    } else {
      max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    auto addressType = Type::i32;
    if (wasm.features.hasMemory64() && oneIn(2)) {
      addressType = Type::i64;
    }
    auto tablePtr =
      builder.makeTable(Names::getValidTableName(wasm, "fuzzing_table"),
                        funcref,
                        initial,
                        max,
                        addressType);
    tablePtr->hasExplicitName = true;
    table = wasm.addTable(std::move(tablePtr));
  }
  funcrefTableName = table->name;
  bool hasFuncrefElemSegment =
    std::any_of(wasm.elementSegments.begin(),
                wasm.elementSegments.end(),
                [&](auto& segment) {
                  return segment->table.is() && segment->type == funcref;
                });
  auto addressType = wasm.getTable(funcrefTableName)->addressType;
  if (!hasFuncrefElemSegment) {
    // TODO: use a random table
    auto segment = std::make_unique<ElementSegment>(
      table->name, builder.makeConst(Literal::makeFromInt32(0, addressType)));
    segment->setName(Names::getValidElementSegmentName(wasm, "elem$"), false);
    wasm.addElementSegment(std::move(segment));
  }

  // When EH is enabled, set up an exnref table.
  if (wasm.features.hasExceptionHandling()) {
    Type exnref = Type(HeapType::exn, Nullable);
    auto iter =
      std::find_if(wasm.tables.begin(), wasm.tables.end(), [&](auto& table) {
        return table->type == exnref;
      });
    if (iter != wasm.tables.end()) {
      // Use the existing one.
      exnrefTableName = iter->get()->name;
    } else {
      // Create a new exnref table.
      Address initial = upTo(10);
      Address max = oneIn(2) ? initial + upTo(4) : Memory::kUnlimitedSize;
      auto tablePtr =
        builder.makeTable(Names::getValidTableName(wasm, "exnref_table"),
                          exnref,
                          initial,
                          max,
                          Type::i32); // TODO: wasm64
      tablePtr->hasExplicitName = true;
      table = wasm.addTable(std::move(tablePtr));
      exnrefTableName = table->name;
    }
  }
}